

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlattribute.cpp
# Opt level: O0

bool __thiscall libcellml::XmlAttribute::isType(XmlAttribute *this,char *name,char *ns)

{
  int iVar1;
  undefined8 uVar2;
  bool local_61;
  string local_40;
  char *local_20;
  char *ns_local;
  char *name_local;
  XmlAttribute *this_local;
  
  local_20 = ns;
  ns_local = name;
  name_local = (char *)this;
  namespaceUri_abi_cxx11_(&local_40,this);
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = xmlStrcmp(uVar2,local_20);
  local_61 = false;
  if (iVar1 == 0) {
    iVar1 = xmlStrcmp(this->mPimpl->mXmlAttributePtr->name,ns_local);
    local_61 = iVar1 == 0;
  }
  std::__cxx11::string::~string((string *)&local_40);
  return local_61;
}

Assistant:

bool XmlAttribute::isType(const char *name, const char *ns) const
{
    return (xmlStrcmp(reinterpret_cast<const xmlChar *>(namespaceUri().c_str()), reinterpret_cast<const xmlChar *>(ns)) == 0)
           && (xmlStrcmp(mPimpl->mXmlAttributePtr->name, reinterpret_cast<const xmlChar *>(name)) == 0);
}